

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_setfenv(lua_State *L,int idx)

{
  uint uVar1;
  uint32_t uVar2;
  TValue *pTVar3;
  int iVar4;
  TValue *pTVar5;
  
  pTVar5 = index2adr(L,idx);
  pTVar3 = L->top;
  uVar1 = pTVar3[-1].u32.lo;
  uVar2 = (pTVar5->field_2).it;
  if (uVar2 == 0xfffffff3) {
LAB_0010c348:
    *(uint *)((ulong)(pTVar5->u32).lo + 8) = uVar1;
  }
  else {
    if (uVar2 != 0xfffffff9) {
      if (uVar2 != 0xfffffff7) {
        iVar4 = 0;
        goto LAB_0010c37f;
      }
      goto LAB_0010c348;
    }
    *(uint *)((ulong)(pTVar5->u32).lo + 0x2c) = uVar1;
  }
  if ((((((GCobj *)(ulong)uVar1)->gch).marked & 3) != 0) &&
     (((((GCobj *)(ulong)(pTVar5->u32).lo)->gch).marked & 4) != 0)) {
    lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,(GCobj *)(ulong)(pTVar5->u32).lo,
                   (GCobj *)(ulong)uVar1);
  }
  pTVar3 = L->top;
  iVar4 = 1;
LAB_0010c37f:
  L->top = pTVar3 + -1;
  return iVar4;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr_check(L, idx);
  GCtab *t;
  lj_checkapi_slot(1);
  lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}